

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

int close(int __fd)

{
  bool bVar1;
  int ret;
  int fd_local;
  
  if (g_sys_close_func == (close_pfn_t)0x0) {
    g_sys_close_func = (close_pfn_t)dlsym(0xffffffffffffffff,"close");
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1) {
    free_by_fd(__fd);
    ret = (*g_sys_close_func)(__fd);
  }
  else {
    ret = (*g_sys_close_func)(__fd);
  }
  return ret;
}

Assistant:

int close(int fd)
{
	HOOK_SYS_FUNC( close );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_close_func( fd );
	}

	free_by_fd( fd );
	int ret = g_sys_close_func(fd);

	return ret;
}